

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_mul_mat(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  int n_dims;
  bool bVar1;
  _Bool _Var2;
  ggml_tensor *src;
  ggml_tensor *pgVar3;
  int ne [4];
  
  _Var2 = ggml_can_mul_mat(a,b);
  if (_Var2) {
    if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    ne[0] = a->ne[1];
    ne[1] = b->ne[1];
    ne[2] = a->ne[2];
    ne[3] = b->ne[3];
    n_dims = b->n_dims;
    if (a->n_dims < b->n_dims) {
      n_dims = a->n_dims;
    }
    src = ggml_new_tensor(ctx,GGML_TYPE_F32,n_dims,ne);
    src->op = GGML_OP_MUL_MAT;
    if (bVar1) {
      pgVar3 = ggml_dup_tensor(ctx,src);
    }
    else {
      pgVar3 = (ggml_tensor *)0x0;
    }
    src->grad = pgVar3;
    src->src0 = a;
    src->src1 = b;
    return src;
  }
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xe4e,
          "ggml_can_mul_mat(a, b)");
  abort();
}

Assistant:

struct ggml_tensor * ggml_mul_mat(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_can_mul_mat(a, b));

    bool is_node = false;

    if (a->grad || b->grad) {
        is_node = true;
    }

    const int ne[4] = { a->ne[1], b->ne[1], a->ne[2], b->ne[3] };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, MIN(a->n_dims, b->n_dims), ne);

    result->op   = GGML_OP_MUL_MAT;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}